

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O1

int __thiscall
ExtraData::parseClipboardData
          (ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val,int pos)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                ClipboardData:      ",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,val);
  iVar1 = Utils::lenFourBytesFromPos(&local_48,pos);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                     Size:          ",0x24);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," bytes",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "The total size in bytes of the Format and Data fields, not including padding (if any)."
             ,0x56);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                     Format:        ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,val);
  iVar2 = Utils::lenFourBytesFromPos(&local_60,pos + 4);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  poVar3 = (ostream *)std::ostream::flush();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "An application-specific identifier for the format of the data in the Data field.",0x50
            );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                     Data:          ",0x24);
  Utils::print_vec_unicode_from_to(val,pos + 8,pos + iVar1 + -8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"MUST be an array of bytes, followed by zero padding to a multiple of 4 bytes.",
             0x4d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return iVar1 + 4;
}

Assistant:

int ExtraData::parseClipboardData(std::vector<unsigned int> val, int pos) {
    cout << "                ClipboardData:      " << endl;
    int len = Utils::lenFourBytesFromPos(val, pos);
    cout << "                     Size:          " << len << " bytes" << endl <<
         Utils::defaultOffsetDocInfo << "The total size in bytes of the Format and Data fields, not including padding (if any)." << endl;
    cout << "                     Format:        " << Utils::lenFourBytesFromPos(val, pos+4) << endl <<
         Utils::defaultOffsetDocInfo << "An application-specific identifier for the format of the data in the Data field." << endl;
    cout << "                     Data:          "; Utils::print_vec_unicode_from_to(val, pos+8, pos + len - 8);
    cout << Utils::defaultOffsetDocInfo << "MUST be an array of bytes, followed by zero padding to a multiple of 4 bytes." << endl;
    return len + 4;
}